

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

char * ssh_sftp_get_cmdline(char *prompt,_Bool no_fds_ok)

{
  int iVar1;
  char *ptr;
  ssize_t sVar2;
  char *__buf;
  size_t oldlen;
  size_t bufsize;
  
  fputs(prompt,_stdout);
  fflush(_stdout);
  bufsize = 0;
  ptr = (char *)0x0;
  oldlen = 0;
  do {
    do {
      iVar1 = ssh_sftp_do_select(true,no_fds_ok);
      if (iVar1 < 0) {
        puts("connection died");
LAB_00114099:
        safefree(ptr);
        return (char *)0x0;
      }
    } while (iVar1 == 0);
    ptr = (char *)safegrowarray(ptr,&bufsize,1,oldlen,1,false);
    __buf = ptr + oldlen;
    sVar2 = read(0,__buf,1);
    if ((int)sVar2 < 0) {
      perror("read");
      goto LAB_00114099;
    }
    if ((int)sVar2 == 0) goto LAB_00114099;
    oldlen = oldlen + 1;
    if (*__buf == '\n') {
      return ptr;
    }
  } while( true );
}

Assistant:

char *ssh_sftp_get_cmdline(const char *prompt, bool no_fds_ok)
{
    char *buf;
    size_t buflen, bufsize;
    int ret;

    fputs(prompt, stdout);
    fflush(stdout);

    buf = NULL;
    buflen = bufsize = 0;

    while (1) {
        ret = ssh_sftp_do_select(true, no_fds_ok);
        if (ret < 0) {
            printf("connection died\n");
            sfree(buf);
            return NULL;               /* woop woop */
        }
        if (ret > 0) {
            sgrowarray(buf, bufsize, buflen);
            ret = read(0, buf+buflen, 1);
            if (ret < 0) {
                perror("read");
                sfree(buf);
                return NULL;
            }
            if (ret == 0) {
                /* eof on stdin; no error, but no answer either */
                sfree(buf);
                return NULL;
            }

            if (buf[buflen++] == '\n') {
                /* we have a full line */
                return buf;
            }
        }
    }
}